

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O2

int Fra_SmlNodesCompareInFrame
              (Fra_Sml_t *p,Aig_Obj_t *pObj0,Aig_Obj_t *pObj1,int iFrame0,int iFrame1)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  
  if (((ulong)pObj0 & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                  ,0x22a,
                  "int Fra_SmlNodesCompareInFrame(Fra_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)")
    ;
  }
  if (((ulong)pObj1 & 1) == 0) {
    if ((iFrame0 != 0) && (p->nWordsTotal <= p->nWordsFrame)) {
      __assert_fail("iFrame0 == 0 || p->nWordsFrame < p->nWordsTotal",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                    ,0x22c,
                    "int Fra_SmlNodesCompareInFrame(Fra_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)"
                   );
    }
    if (iFrame1 == 0) {
      uVar6 = p->nWordsFrame;
      iVar4 = p->nWordsTotal;
    }
    else {
      uVar6 = p->nWordsFrame;
      iVar4 = p->nWordsTotal;
      if (iVar4 <= (int)uVar6) {
        __assert_fail("iFrame1 == 0 || p->nWordsFrame < p->nWordsTotal",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                      ,0x22d,
                      "int Fra_SmlNodesCompareInFrame(Fra_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)"
                     );
      }
    }
    uVar3 = uVar6;
    if ((int)uVar6 < 1) {
      uVar3 = 0;
    }
    uVar5 = 0;
    do {
      if (uVar3 == uVar5) {
        return 1;
      }
      lVar1 = uVar5 * 4;
      lVar2 = uVar5 * 4;
      uVar5 = uVar5 + 1;
    } while (*(int *)((long)&p[1].pAig +
                     lVar1 + (long)(int)(iFrame0 * uVar6) * 4 + (long)(pObj0->Id * iVar4) * 4) ==
             *(int *)((long)&p[1].pAig +
                     lVar2 + (long)(int)(iFrame1 * uVar6) * 4 + (long)(iVar4 * pObj1->Id) * 4));
    return 0;
  }
  __assert_fail("!Aig_IsComplement(pObj1)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                ,0x22b,
                "int Fra_SmlNodesCompareInFrame(Fra_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)");
}

Assistant:

int Fra_SmlNodesCompareInFrame( Fra_Sml_t * p, Aig_Obj_t * pObj0, Aig_Obj_t * pObj1, int iFrame0, int iFrame1 )
{
    unsigned * pSims0, * pSims1;
    int i;
    assert( !Aig_IsComplement(pObj0) );
    assert( !Aig_IsComplement(pObj1) );
    assert( iFrame0 == 0 || p->nWordsFrame < p->nWordsTotal );
    assert( iFrame1 == 0 || p->nWordsFrame < p->nWordsTotal );
    // get hold of the simulation information
    pSims0  = Fra_ObjSim(p, pObj0->Id) + p->nWordsFrame * iFrame0;
    pSims1  = Fra_ObjSim(p, pObj1->Id) + p->nWordsFrame * iFrame1;
    // compare
    for ( i = 0; i < p->nWordsFrame; i++ )
        if ( pSims0[i] != pSims1[i] )
            return 0;
    return 1;
}